

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  int test_case;
  int local_c;
  
  std::istream::operator>>((istream *)&std::cin,&local_c);
  switch(local_c) {
  case 1:
    test1();
    break;
  case 2:
    test2();
    break;
  case 3:
    test3();
    break;
  case 4:
    test4();
    break;
  case 5:
    test5();
    break;
  case 6:
    test6();
    break;
  case 7:
    test7();
    break;
  case 8:
    test8();
    break;
  case 9:
    test9();
    break;
  case 10:
    test10();
    break;
  default:
    goto switchD_00101d97_default;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"OK");
  std::endl<char,std::char_traits<char>>(poVar1);
switchD_00101d97_default:
  return 0;
}

Assistant:

int main() {
  int test_case;
  std::cin >> test_case;
  switch(test_case) {
    case 1: if (test1()) std::cout << "OK" << std::endl; break;
    case 2: if (test2()) std::cout << "OK" << std::endl; break;
    case 3: if (test3()) std::cout << "OK" << std::endl; break;
    case 4: if (test4()) std::cout << "OK" << std::endl; break;
    case 5: if (test5()) std::cout << "OK" << std::endl; break;
    case 6: if (test6()) std::cout << "OK" << std::endl; break;
    case 7: if (test7()) std::cout << "OK" << std::endl; break;
    case 8: if (test8()) std::cout << "OK" << std::endl; break;
    case 9: if (test9()) std::cout << "OK" << std::endl; break;
    case 10: if (test10()) std::cout << "OK" << std::endl; break;
  }

  return 0;
}